

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.cpp
# Opt level: O3

void __thiscall phaeton::Stmt::dump(Stmt *this,uint Indent)

{
  pointer pcVar1;
  long lVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  uint uVar5;
  string Str;
  stringstream StrStream;
  char *local_1f0;
  int local_1e8;
  undefined4 uStack_1e4;
  char local_1e0 [16];
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  ASTNodeKind local_1b0 [4];
  long local_1a0 [3];
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  local_1b0[0] = (this->super_ASTNode).NodeKind;
  pmVar3 = std::
           map<phaeton::ASTNode::ASTNodeKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<phaeton::ASTNode::ASTNodeKind>,_std::allocator<std::pair<const_phaeton::ASTNode::ASTNodeKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&ASTNode::NodeLabel_abi_cxx11_,local_1b0);
  pcVar1 = (pmVar3->_M_dataplus)._M_p;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar1,pcVar1 + pmVar3->_M_string_length);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," <",2);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffffb5 | 8;
  poVar4 = std::ostream::_M_insert<void_const*>((ostream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">",1);
  lVar2 = std::cout;
  *(ulong *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       (ulong)Indent;
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(lVar2 + -0x18)) &
       0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       & 0xffffff4f;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1f0,CONCAT44(uStack_1e4,local_1e8));
  std::__cxx11::stringbuf::str();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  uVar5 = Indent + 1;
  Identifier::dump(this->Id,local_1e8 + uVar5);
  (*(this->RightExpr->super_ASTNode)._vptr_ASTNode[1])(this->RightExpr,(ulong)(local_1e8 + uVar5));
  lVar2 = std::cout;
  *(ulong *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       (ulong)uVar5;
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(lVar2 + -0x18)) &
       0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       & 0xffffff4f;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")\n",2);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  return;
}

Assistant:

void Stmt::dump(unsigned Indent) const {
  std::string Str = NodeLabel[getASTNodeKind()];

  std::stringstream StrStream;
  StrStream << " <" << std::hex << this << ">";

  FORMAT_AST_INDENT(Indent)
  std::cout << "(" << Str << StrStream.str() << "\n";
  Id->dump(Indent + Str.length() + 1);
  RightExpr->dump(Indent + Str.length() + 1);
  FORMAT_AST_INDENT(Indent + 1)
  std::cout << ")\n";
}